

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O1

RSA * SRUP_Crypto::getPubKey(char *key_string)

{
  BIO_METHOD *type;
  BIO *b;
  size_t sVar1;
  RSA *pRVar2;
  RSA *key;
  RSA *local_20;
  
  type = BIO_s_mem();
  b = BIO_new(type);
  sVar1 = strlen(key_string);
  BIO_write(b,key_string,(int)sVar1);
  local_20 = RSA_new();
  pRVar2 = PEM_read_bio_RSA_PUBKEY(b,&local_20,(undefined1 *)0x0,(void *)0x0);
  local_20 = (RSA *)0x0;
  if (pRVar2 != (RSA *)0x0) {
    local_20 = pRVar2;
    BIO_free(b);
  }
  return (RSA *)local_20;
}

Assistant:

RSA* SRUP_Crypto::getPubKey(char *key_string)
{
    RSA *key;

    BIO* bo = BIO_new(BIO_s_mem());

    BIO_write(bo, key_string, strlen(key_string));

    key = RSA_new();
    key = PEM_read_bio_RSA_PUBKEY(bo, &key, nullptr, nullptr);
    if(!key)
        return nullptr;
    BIO_free(bo);
    return key;
}